

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_layer_t.h
# Opt level: O1

void __thiscall pool_layer_t::calc_grads(pool_layer_t *this,tensor_t<float> *grad_next_layer)

{
  tensor_t<float> *this_00;
  float fVar1;
  bool bVar2;
  undefined8 uVar3;
  float *pfVar4;
  int _x;
  int x;
  int _z;
  int _y;
  int y;
  float fVar5;
  range_t rn;
  range_t local_70;
  tensor_t<float> *local_58;
  pool_layer_t *local_50;
  tensor_t<float> *local_48;
  tensor_t<float> *local_40;
  tensor_t<float> *local_38;
  
  if (0 < (this->super_layer_t).in.size.x) {
    local_40 = &(this->super_layer_t).in;
    this_00 = &(this->super_layer_t).out;
    local_58 = &(this->super_layer_t).grads_in;
    x = 0;
    local_50 = this;
    local_48 = this_00;
    local_38 = grad_next_layer;
    do {
      if (0 < (this->super_layer_t).in.size.y) {
        y = 0;
        do {
          map_to_output(&local_70,this,x,y);
          if (0 < (this->super_layer_t).in.size.z) {
            _z = 0;
            do {
              fVar5 = 0.0;
              _x = local_70.min_x;
              fVar1 = 0.0;
              if (local_70.min_x <= local_70.max_x) {
                do {
                  fVar5 = fVar1;
                  _y = local_70.min_y;
                  if (local_70.min_y <= local_70.max_y) {
                    do {
                      pfVar4 = tensor_t<float>::get(local_40,x,y,_z);
                      fVar1 = *pfVar4;
                      pfVar4 = tensor_t<float>::get(this_00,_x,_y,_z);
                      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)*pfVar4),0);
                      pfVar4 = tensor_t<float>::get(local_38,_x,_y,_z);
                      fVar5 = (float)((uint)((byte)uVar3 & 1) * (int)*pfVar4) + fVar5;
                      bVar2 = _y < local_70.max_y;
                      _y = _y + 1;
                    } while (bVar2);
                  }
                  bVar2 = _x < local_70.max_x;
                  _x = _x + 1;
                  fVar1 = fVar5;
                } while (bVar2);
              }
              pfVar4 = tensor_t<float>::get(local_58,x,y,_z);
              *pfVar4 = fVar5;
              _z = _z + 1;
              this = local_50;
            } while (_z < (local_50->super_layer_t).in.size.z);
          }
          y = y + 1;
        } while (y < (this->super_layer_t).in.size.y);
      }
      x = x + 1;
    } while (x < (this->super_layer_t).in.size.x);
  }
  return;
}

Assistant:

void calc_grads(tensor_t<float> &grad_next_layer) {
    for (int x = 0; x < in.size.x; x++) {
      for (int y = 0; y < in.size.y; y++) {
        range_t rn = map_to_output(x, y);
        for (int z = 0; z < in.size.z; z++) {
          float sum_error = 0;
          for (int i = rn.min_x; i <= rn.max_x; i++) {
            int minx = i * stride;
            for (int j = rn.min_y; j <= rn.max_y; j++) {
              int miny = j * stride;

              int is_max = in(x, y, z) == out(i, j, z) ? 1 : 0;
              sum_error += is_max * grad_next_layer(i, j, z);
            }
          }
          grads_in(x, y, z) = sum_error;
        }
      }
    }
  }